

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O3

bool __thiscall ShParser::matchSymbol(ShParser *this,Parser *parser,char symbol)

{
  bool bVar1;
  byte bVar2;
  
  bVar2 = symbol - 0x23;
  if ((bVar2 < 0xb) && ((0x761U >> (bVar2 & 0x1f) & 1) != 0)) {
    bVar1 = Parser::matchToken(parser,*(TokenType *)(&DAT_001901e0 + (ulong)bVar2 * 4),false);
    return bVar1;
  }
  return false;
}

Assistant:

bool ShParser::matchSymbol(Parser& parser, char symbol)
{
	switch (symbol)
	{
	case '(':
		return parser.matchToken(TokenType::LParen);
	case ')':
		return parser.matchToken(TokenType::RParen);
	case ',':
		return parser.matchToken(TokenType::Comma);
	case '#':
		return parser.matchToken(TokenType::Hash);
	case '-':
		return parser.matchToken(TokenType::Minus);
	case '+':
		return parser.matchToken(TokenType::Plus);
	}

	return false;
}